

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcapng.c
# Opt level: O1

PCAPNG_RESULT pcapng_close(PCAPNG_HANDLE *handle)

{
  if ((undefined1 *)0x1 < (undefined1 *)((long)&handle->interface_description->block_type + 1U)) {
    munmap(handle->interface_description,handle->interface_description_size);
  }
  if ((undefined1 *)0x1 < (undefined1 *)((long)&handle->section_header->block_type + 1U)) {
    munmap(handle->section_header,handle->section_header_size);
  }
  if (handle->fd != -1) {
    close(handle->fd);
  }
  return PCAPNG_OK;
}

Assistant:

PCAPNG_RESULT pcapng_close( PCAPNG_HANDLE * handle )
{
	if (handle->interface_description &&
	    (handle->interface_description != MAP_FAILED)) {
		(void) munmap( handle->interface_description,
			       handle->interface_description_size );
	}
	if (handle->section_header &&
	    (handle->section_header != MAP_FAILED)) {
		(void) munmap( handle->section_header,
			       handle->section_header_size );
	}
	if (handle->fd != -1) {
		(void) close( handle->fd );
	}
	return PCAPNG_OK;
}